

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

QString * includeGuard(QString *filename)

{
  bool bVar1;
  long i_00;
  qsizetype qVar2;
  QChar *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  QString *guard;
  QString *in_stack_ffffffffffffffb8;
  QString *this;
  int local_28;
  QChar local_c;
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this = in_RDI;
  QString::toUpper(in_stack_ffffffffffffffb8);
  local_28 = 0;
  while( true ) {
    i_00 = (long)local_28;
    qVar2 = QString::size(this);
    if (qVar2 <= i_00) break;
    local_a = (char16_t)QString::at(this,i_00);
    bVar1 = QChar::isLetterOrNumber((QChar *)0x10f053);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QChar::QChar<char16_t,_true>(&local_c,L'_');
      pQVar3 = QString::operator[](in_stack_ffffffffffffffb8,0x10f079);
      pQVar3->ucs = local_c.ucs;
    }
    local_28 = local_28 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString includeGuard(const QString &filename)
{
    QString guard = filename.toUpper();

    for (int i = 0; i < guard.size(); ++i) {
        if (!guard.at(i).isLetterOrNumber())
            guard[i] = u'_';
    }

    return guard;
}